

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void threadFunc(int id,int numThreads,World *world,Tracer *tracer,Camera *camera,RGBColor *frame)

{
  int iVar1;
  int iVar2;
  int tileHeight;
  int iVar3;
  int iVar4;
  int startX;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  iVar1 = (world->viewplane_).width_;
  iVar2 = (world->viewplane_).height_;
  iVar5 = iVar1 + 0xf;
  if (-1 < iVar1) {
    iVar5 = iVar1;
  }
  iVar6 = (iVar5 >> 4) + 1;
  iVar5 = iVar2 + 0xf;
  if (-1 < iVar2) {
    iVar5 = iVar2;
  }
  iVar7 = 0;
  bVar8 = false;
  do {
    if (bVar8) {
      return;
    }
    iVar3 = iVar7 * numThreads + id;
    iVar4 = iVar3 / iVar6;
    iVar3 = iVar3 % iVar6;
    if (iVar5 >> 4 < iVar4) {
      bVar8 = true;
    }
    else {
      startX = iVar3 * 0x10;
      iVar3 = iVar1 + iVar3 * -0x10;
      if (startX + 0x10 <= iVar1) {
        iVar3 = 0x10;
      }
      tileHeight = iVar2 + iVar4 * -0x10;
      if (iVar4 * 0x10 + 0x10 <= iVar2) {
        tileHeight = 0x10;
      }
      pm::Camera::renderScene(camera,world,tracer,frame,startX,iVar4 * 0x10,iVar3,tileHeight);
      iVar7 = iVar7 + 1;
    }
  } while (iVar4 <= iVar5 >> 4);
  return;
}

Assistant:

void threadFunc(int id, int numThreads, pm::World &world, pm::Tracer &tracer, pm::Camera &camera, pm::RGBColor *frame)
{
	const int width = world.viewPlane().width();
	const int height = world.viewPlane().height();
	const int numColumns = (width / TileSize) + 1;
	const int numRows = (height / TileSize) + 1;

	bool hasFinished = false;
	int iteration = 0;

	while (hasFinished == false)
	{
		const int index = (iteration * numThreads) + id;
		int column = index % numColumns;
		int row = index / numColumns;

		if (row > numRows - 1)
		{
			hasFinished = true;
			break;
		}

		const int startX = column * TileSize;
		const int startY = row * TileSize;
		const int tileSizeX = (startX + TileSize > width) ? width - startX : TileSize;
		const int tileSizeY = (startY + TileSize > height) ? height - startY : TileSize;

		camera.renderScene(world, tracer, frame, startX, startY, tileSizeX, tileSizeY);
		iteration++;
	}
}